

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O3

vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
* testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            (vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,output_type *t)

{
  pointer pfVar1;
  iterator __position;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_impl _Var3;
  long lVar4;
  _Fwd_list_node_base *__to;
  _Self __tmp;
  _Fwd_list_node_base *p_Var5;
  difference_type __n;
  ulong uVar6;
  _Fwd_list_impl local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (t->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
  if (p_Var5 != (_Fwd_list_node_base *)0x0) {
    uVar6 = 0;
    p_Var2 = p_Var5;
    do {
      p_Var2 = p_Var2->_M_next;
      uVar6 = uVar6 + 1;
    } while (p_Var2 != (_Fwd_list_node_base *)0x0);
    local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    ::std::
    vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
    ::_M_realloc_insert<std::forward_list<int,std::allocator<int>>>
              ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                *)__return_storage_ptr__,(iterator)0x0,
               (forward_list<int,_std::allocator<int>_> *)&local_30);
    _Var3._M_head._M_next = local_30._M_head._M_next;
    while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
      operator_delete((void *)_Var3._M_head._M_next,0x10);
      _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
    }
    if (uVar6 != 1) {
      lVar4 = (uVar6 >> 1) + (ulong)(uVar6 >> 1 == 0);
      do {
        pfVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var3._M_head._M_next = (_Fwd_list_node_base)operator_new(0x10);
        *(undefined4 *)&((_Fwd_list_node_base *)((long)_Var3._M_head._M_next + 8))->_M_next =
             *(undefined4 *)&p_Var5[1]._M_next;
        *(_Fwd_list_node_base **)_Var3._M_head._M_next =
             (_Fwd_list_node_base *)
             (pfVar1->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head;
        (pfVar1->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head =
             _Var3._M_head._M_next;
        p_Var5 = p_Var5->_M_next;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      if (uVar6 != 1) {
        local_30._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
          ::_M_realloc_insert<std::forward_list<int,std::allocator<int>>>
                    ((vector<std::forward_list<int,std::allocator<int>>,std::allocator<std::forward_list<int,std::allocator<int>>>>
                      *)__return_storage_ptr__,__position,
                     (forward_list<int,_std::allocator<int>_> *)&local_30);
          _Var3._M_head._M_next = local_30._M_head._M_next;
          while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
            p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
            operator_delete((void *)_Var3._M_head._M_next,0x10);
            _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
          }
        }
        else {
          ((__position._M_current)->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head
          ._M_next = (_Fwd_list_node_base *)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        if (p_Var5 != (_Fwd_list_node_base *)0x0) {
          pfVar1 = (__return_storage_ptr__->
                   super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          do {
            _Var3._M_head._M_next = (_Fwd_list_node_base)operator_new(0x10);
            *(undefined4 *)&((_Fwd_list_node_base *)((long)_Var3._M_head._M_next + 8))->_M_next =
                 *(undefined4 *)&p_Var5[1]._M_next;
            *(_Fwd_list_node_base **)_Var3._M_head._M_next =
                 (_Fwd_list_node_base *)
                 pfVar1[1].super__Fwd_list_base<int,_std::allocator<int>_>._M_impl._M_head;
            pfVar1[1].super__Fwd_list_base<int,_std::allocator<int>_>._M_impl._M_head =
                 _Var3._M_head._M_next;
            p_Var5 = p_Var5->_M_next;
          } while (p_Var5 != (_Fwd_list_node_base *)0x0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<output_type> shrink(const output_type& t)
    {
      std::vector<output_type> v;
      if (t.empty()) return v;
      auto l = std::distance(t.cbegin(), t.cend()) / 2;
      auto it = t.cbegin();
      v.push_back(output_type());
      for (auto count = 0; count < l; count++, it++)
        v[0].push_front(*it);
      if (l > 0)
      {
        v.push_back(output_type());
        copy(it, t.cend(), std::front_inserter(v[1]));
      }
      return v;
    }